

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_object.cpp
# Opt level: O2

object_ptr __thiscall mjs::new_number(mjs *this,object_ptr *prototype,double val)

{
  gc_heap *args;
  undefined8 extraout_RDX;
  object_ptr oVar1;
  gc_heap_ptr<mjs::number_object> o;
  undefined1 local_50 [32];
  double local_30;
  
  args = (prototype->super_gc_heap_ptr_untyped).heap_;
  local_30 = val;
  gc_heap_ptr_untyped::get(&prototype->super_gc_heap_ptr_untyped);
  object::class_name((object *)(local_50 + 0x10));
  gc_heap::make<mjs::number_object,mjs::string,mjs::gc_heap_ptr<mjs::object>const&,double&>
            ((gc_heap *)local_50,(string *)args,(gc_heap_ptr<mjs::object> *)(local_50 + 0x10),
             (double *)prototype);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_50 + 0x10));
  gc_heap_ptr_untyped::gc_heap_ptr_untyped
            ((gc_heap_ptr_untyped *)this,(gc_heap_ptr_untyped *)local_50);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_50);
  oVar1.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  oVar1.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (object_ptr)oVar1.super_gc_heap_ptr_untyped;
}

Assistant:

object_ptr new_number(const object_ptr& prototype,  double val) {
    auto o = prototype.heap().make<number_object>(prototype->class_name(), prototype, val);
    return o;
}